

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O3

void duckdb::QuantileListFallback::
     Finalize<duckdb::list_entry_t,duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>>
               (QuantileState<duckdb::string_t,_duckdb::QuantileStringType> *state,
               list_entry_t *target,AggregateFinalizeData *finalize_data)

{
  AggregateInputData *this;
  _func_int **pp_Var1;
  Vector *pVVar2;
  idx_t iVar3;
  reference q_00;
  idx_t iVar4;
  FunctionData *pFVar5;
  uint64_t uVar6;
  OrderModifiers in_R9W;
  unsigned_long *q;
  _func_int **pp_Var7;
  RESULT_TYPE RVar8;
  string_t sort_key;
  QuantileDirect<duckdb::string_t> local_89;
  FunctionData *local_88;
  list_entry_t *local_80;
  AggregateFinalizeData *local_78;
  Vector *local_70;
  idx_t local_68;
  vector<duckdb::QuantileValue,_true> *local_60;
  Interpolator<true> local_58;
  
  if ((state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
      super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
      super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this = finalize_data->input;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
    pFVar5 = (this->bind_data).ptr;
    local_70 = ListVector::GetEntry(finalize_data->result);
    iVar3 = ListVector::GetListSize(finalize_data->result);
    ListVector::Reserve(finalize_data->result,
                        ((long)pFVar5[2]._vptr_FunctionData - (long)pFVar5[1]._vptr_FunctionData >>
                        3) * 0x4ec4ec4ec4ec4ec5 + iVar3);
    pVVar2 = local_70;
    target->offset = iVar3;
    pp_Var7 = pFVar5[4]._vptr_FunctionData;
    pp_Var1 = pFVar5[5]._vptr_FunctionData;
    if (pp_Var7 != pp_Var1) {
      local_60 = (vector<duckdb::QuantileValue,_true> *)(pFVar5 + 1);
      iVar4 = 0;
      local_88 = pFVar5;
      local_80 = target;
      local_78 = finalize_data;
      local_68 = iVar3;
      do {
        q_00 = vector<duckdb::QuantileValue,_true>::operator[](local_60,(size_type)*pp_Var7);
        iVar3 = (long)(state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
                      super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
                      super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 4;
        local_58.desc = *(bool *)&local_88[7]._vptr_FunctionData;
        local_58.FRN = Interpolator<true>::Index(q_00,iVar3);
        local_58.CRN = local_58.FRN;
        local_58.begin = iVar4;
        local_58.end = iVar3;
        RVar8 = Interpolator<true>::
                InterpolateInternal<duckdb::string_t,duckdb::QuantileDirect<duckdb::string_t>>
                          (&local_58,
                           (state->v).
                           super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
                           super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
                           _M_impl.super__Vector_impl_data._M_start,&local_89);
        sort_key.value.pointer.ptr = (char *)pVVar2;
        sort_key.value._0_8_ = RVar8.value._8_8_;
        CreateSortKeyHelpers::DecodeSortKey
                  (RVar8.value._0_8_,sort_key,(Vector *)(*pp_Var7 + local_68),0x302,in_R9W);
        pp_Var7 = pp_Var7 + 1;
        iVar4 = local_58.FRN;
      } while (pp_Var7 != pp_Var1);
      iVar3 = local_80->offset;
      target = local_80;
      pFVar5 = local_88;
      finalize_data = local_78;
    }
    uVar6 = ((long)pFVar5[2]._vptr_FunctionData - (long)pFVar5[1]._vptr_FunctionData >> 3) *
            0x4ec4ec4ec4ec4ec5;
    target->length = uVar6;
    ListVector::SetListSize(finalize_data->result,uVar6 + iVar3);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());

		D_ASSERT(state.v.data());

		auto &entry = target;
		entry.offset = ridx;
		idx_t lower = 0;
		for (const auto &q : bind_data.order) {
			const auto &quantile = bind_data.quantiles[q];
			Interpolator<true> interp(quantile, state.v.size(), bind_data.desc);
			interp.begin = lower;
			auto interpolation_result = interp.InterpolateInternal<string_t>(state.v.data());
			CreateSortKeyHelpers::DecodeSortKey(interpolation_result, result, ridx + q,
			                                    OrderModifiers(OrderType::ASCENDING, OrderByNullType::NULLS_LAST));
			lower = interp.FRN;
		}
		entry.length = bind_data.quantiles.size();

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}